

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
tools::xar::split<char>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,xar *this,char *delim,string_view s,ssize_t nsplits)

{
  size_type sVar1;
  char *pcVar2;
  size_t sVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  const_iterator local_80;
  const_iterator local_78;
  const_iterator local_70;
  const_iterator local_68;
  size_type local_60;
  size_type next;
  const_iterator local_48;
  const_iterator local_40;
  undefined1 local_31;
  char *local_30;
  ssize_t nsplits_local;
  char *delim_local;
  string_view s_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  local_30 = s._M_str;
  s_local._M_len = s._M_len;
  local_31 = 0;
  nsplits_local = (ssize_t)this;
  delim_local = delim;
  s_local._M_str = (char *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar4._M_str = (char *)s_local._M_len;
  bVar4._M_len = (size_t)delim_local;
  while( true ) {
    s_local._M_len = (size_t)bVar4._M_str;
    delim_local = (char *)bVar4._M_len;
    if (-1 < (long)local_30) {
      pcVar2 = (char *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(__return_storage_ptr__);
      bVar4._M_str = (char *)s_local._M_len;
      bVar4._M_len = (size_t)delim_local;
      if (local_30 <= pcVar2) {
        local_40 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                             ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local);
        local_48 = std::basic_string_view<char,_std::char_traits<char>_>::end
                             ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*,char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_40,&local_48);
        return __return_storage_ptr__;
      }
    }
    s_local._M_len = (size_t)bVar4._M_str;
    delim_local = (char *)bVar4._M_len;
    local_60 = std::basic_string_view<char,_std::char_traits<char>_>::find
                         ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local,
                          *(char *)nsplits_local,0);
    if (local_60 == 0xffffffffffffffff) break;
    local_78 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                         ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local);
    local_80 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                         ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local);
    local_80 = local_80 + local_60;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*,char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_78,&local_80);
    sVar1 = local_60;
    sVar3 = anon_unknown_0::delimSize(*(char *)nsplits_local);
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local,
                       sVar1 + sVar3,0xffffffffffffffff);
  }
  local_68 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local);
  local_70 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const*,char_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_68,&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
split(const DelimType& delim, std::string_view s, const ssize_t nsplits = -1) {
  std::vector<std::string> ret;

  while (true) {
    if (nsplits > -1 && ret.size() >= nsplits) {
      ret.emplace_back(s.begin(), s.end());
      break;
    }

    auto next = s.find(delim);
    if (next == std::string::npos) {
      ret.emplace_back(s.begin(), s.end());
      break;
    }

    ret.emplace_back(s.begin(), s.begin() + next);
    s = s.substr(next + delimSize(delim));
  }

  return ret;
}